

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O0

void printS16ImmOperand_Mem(MCInst *MI,uint OpNo,SStream *O)

{
  cs_detail *pcVar1;
  _Bool _Var2;
  short sVar3;
  MCOperand *pMVar4;
  int64_t iVar5;
  uint8_t *puVar6;
  SStream *in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  MCInst *unaff_retaddr;
  short Imm;
  undefined4 in_stack_fffffffffffffff0;
  
  pMVar4 = MCInst_getOperand(in_RDI,in_ESI);
  _Var2 = MCOperand_isImm(pMVar4);
  if (_Var2) {
    pMVar4 = MCInst_getOperand(in_RDI,in_ESI);
    iVar5 = MCOperand_getImm(pMVar4);
    sVar3 = (short)iVar5;
    if (sVar3 < 0) {
      if (sVar3 < -9) {
        SStream_concat(in_RDX,"-0x%x",(ulong)(uint)-(int)sVar3);
      }
      else {
        SStream_concat(in_RDX,"-%u",(ulong)(uint)-(int)sVar3);
      }
    }
    else if (sVar3 < 10) {
      SStream_concat(in_RDX,"%u",(ulong)(uint)(int)sVar3);
    }
    else {
      SStream_concat(in_RDX,"0x%x",(ulong)(uint)(int)sVar3);
    }
    if (in_RDI->csh->detail != CS_OPT_OFF) {
      if ((in_RDI->csh->doing_mem & 1U) == 0) {
        puVar6 = in_RDI->flat_insn->detail->groups +
                 (ulong)(in_RDI->flat_insn->detail->field_6).x86.addr_size * 0x18 + 0x1d;
        puVar6[0] = '\x02';
        puVar6[1] = '\0';
        puVar6[2] = '\0';
        puVar6[3] = '\0';
        *(long *)(in_RDI->flat_insn->detail->groups +
                 (ulong)(in_RDI->flat_insn->detail->field_6).x86.addr_size * 0x18 + 0x25) =
             (long)sVar3;
        pcVar1 = in_RDI->flat_insn->detail;
        (pcVar1->field_6).x86.addr_size = (pcVar1->field_6).x86.addr_size + '\x01';
      }
      else {
        *(int *)(in_RDI->flat_insn->detail->groups +
                (ulong)(in_RDI->flat_insn->detail->field_6).x86.addr_size * 0x18 + 0x29) =
             (int)sVar3;
      }
    }
  }
  else {
    printOperand(unaff_retaddr,(uint)((ulong)in_RDI >> 0x20),
                 (SStream *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

static void printS16ImmOperand_Mem(MCInst *MI, unsigned OpNo, SStream *O)
{
	if (MCOperand_isImm(MCInst_getOperand(MI, OpNo))) {
		short Imm = (short)MCOperand_getImm(MCInst_getOperand(MI, OpNo));

		if (Imm >= 0) {
			if (Imm > HEX_THRESHOLD)
				SStream_concat(O, "0x%x", Imm);
			else
				SStream_concat(O, "%u", Imm);
		} else {
			if (Imm < -HEX_THRESHOLD)
				SStream_concat(O, "-0x%x", -Imm);
			else
				SStream_concat(O, "-%u", -Imm);
		}

		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].mem.disp = Imm;
			} else {
				MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].type = PPC_OP_IMM;
				MI->flat_insn->detail->ppc.operands[MI->flat_insn->detail->ppc.op_count].imm = Imm;
				MI->flat_insn->detail->ppc.op_count++;
			}
		}
	} else
		printOperand(MI, OpNo, O);
}